

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arenas_lookup_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  int iVar4;
  uint *puVar5;
  void *pvVar6;
  ulong uVar7;
  size_t __n;
  ulong uVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  ulong uVar11;
  rtree_leaf_elm_t *prVar12;
  rtree_ctx_t *ctx;
  bool bVar13;
  rtree_ctx_t local_1b0;
  
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar4 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    uVar11 = 0;
  }
  else {
    iVar4 = 0x16;
    if (newlen != 8) goto LAB_00121756;
    uVar11 = *newp;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = &local_1b0;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar6 = (void *)(uVar11 & 0xffffffffc0000000);
  uVar7 = (ulong)(((uint)(uVar11 >> 0x1e) & 0xf) << 4);
  prVar12 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar7);
  pvVar2 = *(void **)((long)&ctx->cache[0].leafkey + uVar7);
  if (pvVar2 == pvVar6) {
    prVar12 = (rtree_leaf_elm_t *)
              ((ulong)((uint)(uVar11 >> 9) & 0x1ffff8) + (long)prVar12[1].le_bits.repr);
  }
  else if ((void *)ctx->l2_cache[0].leafkey == pvVar6) {
    prVar3 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar12[1].le_bits.repr;
    (prVar12->le_bits).repr = pvVar6;
    prVar12[1].le_bits.repr = prVar3;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar3->le_bits).repr + (ulong)((uint)uVar11 >> 9 & 0x1ffff8));
  }
  else {
    prVar9 = ctx->l2_cache + 1;
    if ((void *)ctx->l2_cache[1].leafkey == pvVar6) {
      uVar8 = 0;
      bVar13 = false;
    }
    else {
      uVar7 = 1;
      prVar10 = prVar9;
      do {
        uVar8 = uVar7;
        bVar13 = 6 < uVar8;
        if (uVar8 == 7) goto LAB_00121821;
        prVar9 = prVar10 + 1;
        prVar1 = prVar10 + 1;
        uVar7 = uVar8 + 1;
        prVar10 = prVar9;
      } while ((void *)prVar1->leafkey != pvVar6);
      bVar13 = 6 < uVar8;
    }
    prVar3 = prVar9->leaf;
    prVar9->leafkey = ctx->l2_cache[uVar8].leafkey;
    prVar9->leaf = ctx->l2_cache[uVar8].leaf;
    ctx->l2_cache[uVar8].leafkey = (uintptr_t)pvVar2;
    ctx->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)prVar12[1].le_bits.repr;
    (prVar12->le_bits).repr = pvVar6;
    prVar12[1].le_bits.repr = prVar3;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar3->le_bits).repr + (ulong)((uint)(uVar11 >> 9) & 0x1ffff8));
LAB_00121821:
    if (bVar13) {
      prVar12 = rtree_leaf_elm_lookup_hard((tsdn_t *)tsd,&extents_rtree,ctx,uVar11,true,false);
    }
  }
  iVar4 = 0x16;
  puVar5 = (uint *)(((long)(prVar12->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  if ((puVar5 != (uint *)0x0) && (arenas[*puVar5 & 0xfff].repr != (void *)0x0)) {
    local_1b0.cache[0].leafkey._0_4_ =
         **(undefined4 **)((long)arenas[*puVar5 & 0xfff].repr + 0x7328);
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar11 = *oldlenp;
      if (uVar11 != 4) {
        __n = 4;
        if (uVar11 < 4) {
          __n = uVar11;
        }
        memcpy(oldp,&local_1b0,__n);
        goto LAB_00121756;
      }
      *(undefined4 *)oldp = (undefined4)local_1b0.cache[0].leafkey;
    }
    iVar4 = 0;
  }
LAB_00121756:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar4;
}

Assistant:

static int
arenas_lookup_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	void *ptr;
	extent_t *extent;
	arena_t *arena;

	ptr = NULL;
	ret = EINVAL;
	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(ptr, void *);
	extent = iealloc(tsd_tsdn(tsd), ptr);
	if (extent == NULL)
		goto label_return;

	arena = extent_arena_get(extent);
	if (arena == NULL)
		goto label_return;

	arena_ind = arena_ind_get(arena);
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}